

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_peer_eviction_tests.cpp
# Opt level: O0

bool net_peer_eviction_tests::IsEvicted
               (vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *candidates,
               unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
               *node_ids,FastRandomContext *random_context)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *in_RSI;
  long in_FS_OFFSET;
  FastRandomContext *unaff_retaddr;
  optional<long> evicted_node_id;
  vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *in_stack_00000090;
  optional<long> *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::begin
            ((vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *)
             CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::end
            ((vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *)
             CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  std::
  shuffle<__gnu_cxx::__normal_iterator<NodeEvictionCandidate*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>,FastRandomContext&>
            ((__normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
              )evicted_node_id.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._8_8_,
             (__normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
              )evicted_node_id.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload,unaff_retaddr);
  SelectNodeToEvict(in_stack_00000090);
  bVar2 = std::optional::operator_cast_to_bool(in_stack_ffffffffffffff98);
  if (bVar2) {
    std::optional<long>::operator*(in_stack_ffffffffffffff98);
    sVar3 = std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
            count(in_RSI,(key_type *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    local_19 = sVar3 != 0;
  }
  else {
    local_19 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool IsEvicted(std::vector<NodeEvictionCandidate> candidates, const std::unordered_set<NodeId>& node_ids, FastRandomContext& random_context)
{
    std::shuffle(candidates.begin(), candidates.end(), random_context);
    const std::optional<NodeId> evicted_node_id = SelectNodeToEvict(std::move(candidates));
    if (!evicted_node_id) {
        return false;
    }
    return node_ids.count(*evicted_node_id);
}